

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QGraphicsItemPrivate::ExtraStruct>::end(QList<QGraphicsItemPrivate::ExtraStruct> *this)

{
  ExtraStruct *n;
  QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QGraphicsItemPrivate::ExtraStruct> *)0x99b9f9);
  QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::operator->(in_RDI);
  n = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }